

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
::clear(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        *this)

{
  slot_type *psVar1;
  group_type_pointer pgVar2;
  size_t sVar3;
  long lVar4;
  
  if ((this->arrays).elements_ != (value_type_pointer)0x0) {
    sVar3 = (this->arrays).groups_size_mask;
    pgVar2 = (this->arrays).groups_;
    for (lVar4 = 0; sVar3 * 0x10 + 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
      psVar1 = pgVar2->m + lVar4;
      psVar1->n = '\0';
      psVar1[1] = '\0';
      psVar1[2] = '\0';
      psVar1[3] = '\0';
      psVar1[4] = '\0';
      psVar1[5] = '\0';
      psVar1[6] = '\0';
      psVar1[7] = '\0';
      psVar1[8] = '\0';
      psVar1[9] = '\0';
      psVar1[10] = '\0';
      psVar1[0xb] = '\0';
      psVar1[0xc] = '\0';
      psVar1[0xd] = '\0';
      psVar1[0xe] = '\0';
      psVar1[0xf] = '\0';
    }
    (this->arrays).groups_[(this->arrays).groups_size_mask].m[0xe].n = '\x01';
    sVar3 = initial_max_load(this);
    (this->size_ctrl).ml = sVar3;
    (this->size_ctrl).size = 0;
  }
  return;
}

Assistant:

void clear() noexcept {
        auto p = arrays.elements();
        if (p) {
            for (auto pg = arrays.groups(), last = pg + arrays.groups_size_mask + 1; pg != last;
                 ++pg, p += N) {
                auto mask = match_really_occupied(pg, last);
                while (mask) {
                    destroy_element(p + unchecked_countr_zero(mask));
                    mask &= mask - 1;
                }
                /* we wipe the entire metadata to reset the overflow byte as well */
                pg->initialize();
            }
            arrays.groups()[arrays.groups_size_mask].set_sentinel();
            size_ctrl.ml = initial_max_load();
            size_ctrl.size = 0;
        }
    }